

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall cmGeneratorTarget::GetExportMacro_abi_cxx11_(cmGeneratorTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  string *a;
  string in;
  string local_50;
  string local_30;
  
  TVar2 = GetType(this);
  if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (string *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"DEFINE_SYMBOL",(allocator<char> *)&local_30);
  cVar3 = GetProperty(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (cVar3.Value == (string *)0x0) {
    a = GetName_abi_cxx11_(this);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[9]>(&local_50,a,(char (*) [9])0x770b7f);
    cmsys::SystemTools::MakeCidentifier(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->ExportMacro);
  }
  return &this->ExportMacro;
}

Assistant:

const std::string* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (cmValue custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = *custom_export_name;
    } else {
      std::string in = cmStrCat(this->GetName(), "_EXPORTS");
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return &this->ExportMacro;
  }
  return nullptr;
}